

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O0

void __thiscall cmCPackComponent::~cmCPackComponent(cmCPackComponent *this)

{
  cmCPackComponent *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Files);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::~vector
            (&this->ReverseDependencies);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::~vector(&this->Dependencies)
  ;
  std::__cxx11::string::~string((string *)&this->Plist);
  std::__cxx11::string::~string((string *)&this->ArchiveFile);
  std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::~vector
            (&this->InstallationTypes);
  std::__cxx11::string::~string((string *)&this->Description);
  std::__cxx11::string::~string((string *)&this->DisplayName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmCPackComponent()
    : IsRequired(true)
    , IsHidden(false)
    , IsDisabledByDefault(false)
    , IsDownloaded(false)
  {
  }